

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

uint32_t mp_decode_array_slowpath(uint8_t c,char **data)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar1 = (uint *)*data;
  if ((c & 1) == 0) {
    puVar3 = (uint *)((long)puVar1 + 2);
    uVar2 = (uint)(ushort)((ushort)*puVar1 << 8 | (ushort)*puVar1 >> 8);
  }
  else {
    uVar2 = *puVar1;
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    puVar3 = puVar1 + 1;
  }
  *data = (char *)puVar3;
  return uVar2;
}

Assistant:

MP_IMPL uint32_t
mp_decode_array_slowpath(uint8_t c, const char **data)
{
	uint32_t size;
	switch (c & 0x1) {
	case 0xdc & 0x1:
		size = mp_load_u16(data);
		return size;
	case 0xdd & 0x1:
		size = mp_load_u32(data);
		return size;
	default:
		mp_unreachable();
	}
}